

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_cfi_setPC(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc)

{
  ulong uVar1;
  size_t advanceFactor;
  size_t advance;
  size_t pc_local;
  sysbvm_dwarf_cfi_builder_t *cfi_local;
  
  uVar1 = pc - cfi->currentPC;
  if (uVar1 != 0) {
    uVar1 = uVar1 / (cfi->cie).codeAlignmentFactor;
    if (uVar1 < 0x40) {
      sysbvm_dwarf_encodeByte(&cfi->buffer,(byte)uVar1 | 0x40);
    }
    else if (uVar1 < 0x100) {
      sysbvm_dwarf_encodeByte(&cfi->buffer,'\x02');
      sysbvm_dwarf_encodeByte(&cfi->buffer,(byte)uVar1);
    }
    else if (uVar1 < 0x10000) {
      sysbvm_dwarf_encodeByte(&cfi->buffer,'\x03');
      sysbvm_dwarf_encodeWord(&cfi->buffer,(uint16_t)uVar1);
    }
    else {
      if (0xffffffff < uVar1) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dwarf.c:243: assertion failure: advanceFactor <= 0xFFFFFFFF"
                  );
      }
      sysbvm_dwarf_encodeByte(&cfi->buffer,'\x04');
      sysbvm_dwarf_encodeDWord(&cfi->buffer,(uint32_t)uVar1);
    }
  }
  cfi->currentPC = pc;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_setPC(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc)
{
    size_t advance = pc - cfi->currentPC;
    if(advance)
    {
        size_t advanceFactor = advance / cfi->cie.codeAlignmentFactor;
        if(advanceFactor <= 63)
        {
            sysbvm_dwarf_encodeByte(&cfi->buffer, (DW_OP_CFA_advance_loc << 6) | (uint8_t)advanceFactor);
        }
        else
        {
            if(advanceFactor <= 0xFF)
            {
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc1);
                sysbvm_dwarf_encodeByte(&cfi->buffer, (uint8_t)advanceFactor);
            }
            else if(advanceFactor <= 0xFFFF)
            {
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc2);
                sysbvm_dwarf_encodeWord(&cfi->buffer, (uint16_t)advanceFactor);
            }
            else
            {
                SYSBVM_ASSERT(advanceFactor <= 0xFFFFFFFF);
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc4);
                sysbvm_dwarf_encodeDWord(&cfi->buffer, (uint32_t)advanceFactor);
            }
        }
    }

    cfi->currentPC = pc;
}